

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  ulong extraout_RAX;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar15;
  binary_op_pow op;
  __m128 _p1;
  __m128 _p;
  binary_op_pow local_85;
  uint local_84;
  Mat *local_80;
  Mat *local_78;
  Mat *local_70;
  ulong local_68;
  ulong local_60;
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [4];
  
  local_84 = a->h * a->w * a->d * a->elempack;
  uVar7 = (ulong)local_84;
  local_60 = 0;
  local_80 = b;
  local_78 = a;
  local_70 = c;
  local_68 = (ulong)(uint)a->c;
  if (a->c < 1) {
    local_68 = local_60;
  }
  while (local_60 != local_68) {
    lVar13 = local_78->elemsize * local_78->cstep * local_60;
    pvVar2 = local_78->data;
    lVar12 = local_80->elemsize * local_80->cstep * local_60;
    pvVar3 = local_80->data;
    lVar10 = local_70->elemsize * local_70->cstep * local_60;
    pvVar4 = local_70->data;
    lVar11 = 0;
    lVar9 = 0;
    for (iVar8 = 0; uVar6 = local_60, uVar7 = (ulong)(iVar8 + 3U), (int)(iVar8 + 3U) < (int)local_84
        ; iVar8 = iVar8 + 4) {
      pfVar1 = (float *)((long)pvVar2 + lVar9 + lVar13);
      local_48 = *(float (*) [2])pfVar1;
      afStack_40._0_8_ = *(undefined8 *)(pfVar1 + 2);
      pfVar1 = (float *)((long)pvVar3 + lVar9 + lVar12);
      local_58 = *(float (*) [2])pfVar1;
      afStack_50 = *(float (*) [2])(pfVar1 + 2);
      afVar15 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                          (&local_85,(__m128 *)local_48,(__m128 *)local_58);
      auVar5._8_4_ = extraout_XMM0_Dc;
      auVar5._0_8_ = afVar15._0_8_;
      auVar5._12_4_ = extraout_XMM0_Dd;
      *(undefined1 (*) [16])((long)pvVar4 + lVar9 + lVar10) = auVar5;
      lVar9 = lVar9 + 0x10;
      lVar11 = lVar11 + 4;
    }
    for (; (int)lVar11 < (int)local_84; lVar11 = lVar11 + 1) {
      fVar14 = powf(*(float *)((long)pvVar2 + lVar11 * 4 + lVar13),
                    *(float *)((long)pvVar3 + lVar11 * 4 + lVar12));
      *(float *)((long)pvVar4 + lVar11 * 4 + lVar10) = fVar14;
      uVar7 = extraout_RAX;
    }
    local_60 = uVar6 + 1;
  }
  return (int)uVar7;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}